

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

DWORD * __thiscall ExportEntryWrapper::getFuncRvaPtr(ExportEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  IMAGE_EXPORT_DIRECTORY *pIVar3;
  undefined4 extraout_var;
  DWORD *ptr;
  uint64_t funcRva;
  IMAGE_EXPORT_DIRECTORY *exp;
  ExportEntryWrapper *this_local;
  
  if (this->parentDir == (ExportDirWrapper *)0x0) {
    this_local = (ExportEntryWrapper *)0x0;
  }
  else {
    pIVar3 = ExportDirWrapper::exportDir(this->parentDir);
    if (pIVar3 == (IMAGE_EXPORT_DIRECTORY *)0x0) {
      this_local = (ExportEntryWrapper *)0x0;
    }
    else {
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,(this->super_ExeNodeWrapper).entryNum * 4 +
                                (ulong)pIVar3->AddressOfFunctions,2,4,0);
      this_local = (ExportEntryWrapper *)CONCAT44(extraout_var,iVar2);
    }
  }
  return (DWORD *)this_local;
}

Assistant:

DWORD* ExportEntryWrapper::getFuncRvaPtr()
{
    if (this->parentDir == NULL) return NULL;
    IMAGE_EXPORT_DIRECTORY* exp = parentDir->exportDir();
    if (exp == NULL) return NULL;

    uint64_t funcRva = exp->AddressOfFunctions;
    funcRva += (this->entryNum * sizeof(DWORD));

    DWORD *ptr =  (DWORD*) m_Exe->getContentAt(funcRva, Executable::RVA, sizeof(DWORD));
    return ptr;
}